

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O1

ON_wString __thiscall
ON_wString::MapStringOrdinal(ON_wString *this,ON_StringMapOrdinalType map_type)

{
  bool bVar1;
  int element_count;
  ON_StringMapOrdinalType in_EDX;
  undefined4 in_register_00000034;
  
  ON_wString(this,(ON_wString *)CONCAT44(in_register_00000034,map_type));
  if (in_EDX != Identity) {
    bVar1 = IsNotEmpty(this);
    if (bVar1) {
      CopyArray(this);
      element_count = Length(this);
      MapStringOrdinal(in_EDX,this->m_s,element_count,this->m_s,element_count);
    }
  }
  return (ON_wString)(wchar_t *)this;
}

Assistant:

ON_wString ON_wString::MapStringOrdinal(
  ON_StringMapOrdinalType map_type
  ) const
{
  ON_wString mapped_string(*this);
  if (ON_StringMapOrdinalType::Identity != map_type && mapped_string.IsNotEmpty())
  {
    mapped_string.CopyArray();
    const int length = mapped_string.Length();
    ON_wString::MapStringOrdinal(map_type, mapped_string.m_s, length, mapped_string.m_s, length);
  }
  return mapped_string;
}